

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O3

void __thiscall Net::propagate_front(Net *this,int cur_layer)

{
  pointer pvVar1;
  pointer pvVar2;
  void *pvVar3;
  pointer pdVar4;
  double *pdVar5;
  double dVar6;
  long lVar7;
  double *i;
  double *pdVar8;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  
  lVar7 = (long)cur_layer;
  pvVar1 = (this->weights).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_40,
             (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar7 + -1);
  mult_matrix<double>(&local_58,pvVar1 + lVar7,&local_40);
  add_matrix<double>(&local_78,&local_58,
                     (this->biases).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar7);
  pvVar2 = (this->meshZ).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = pvVar2[lVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = *(pointer *)
            ((long)&pvVar2[lVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  pvVar2[lVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&pvVar2[lVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 8) =
       local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  *(pointer *)
   ((long)&pvVar2[lVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)pdVar4 - (long)pvVar3);
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::operator=
            ((this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar7,
             (this->meshZ).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar7);
  pvVar2 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar5 = *(pointer *)
            ((long)&pvVar2[lVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 8);
  for (pdVar8 = pvVar2[lVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar8 != pdVar5; pdVar8 = pdVar8 + 1) {
    dVar6 = function(this,*pdVar8);
    *pdVar8 = dVar6;
  }
  return;
}

Assistant:

void Net::propagate_front(int cur_layer){
    meshZ[cur_layer] = add_matrix<double>(mult_matrix<double>(weights[cur_layer], mesh[cur_layer-1]), biases[cur_layer]);
    mesh[cur_layer] = meshZ[cur_layer];
    for (double & i : mesh[cur_layer])
        i = function(i);
}